

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIdentifier(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  char cVar1;
  code *pcVar2;
  OpCodeAsmJs op;
  bool bVar3;
  uint uVar4;
  int iVar5;
  RegSlot R1;
  RegSlot RVar6;
  undefined4 *puVar7;
  IdentPtr name;
  AsmJsSymbol *sym;
  AsmJsVarBase *pAVar8;
  AsmJsVar *pAVar9;
  AsmJsMathConst *pAVar10;
  AsmJsCompilationException *this_00;
  ulong uVar11;
  ulong uVar12;
  AsmJsType local_30;
  Source local_2c [2];
  Source source;
  
  if ((pnode->nop != knopName) && (pnode->nop != knopStr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x575,"(ParserWrapper::IsNameDeclaration( pnode ))",
                                "ParserWrapper::IsNameDeclaration( pnode )");
    if (!bVar3) goto LAB_0086526c;
    *puVar7 = 0;
  }
  name = ParseNode::name(pnode);
  sym = AsmJsModuleCompiler::LookupIdentifier(this->mCompiler,name,this->mFunction,local_2c);
  if (sym == (AsmJsSymbol *)0x0) {
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Undefined identifier %s",&name->field_0x22);
LAB_0086525b:
    __cxa_throw(this_00,&AsmJsCompilationException::typeinfo,0);
  }
  switch(sym->mType) {
  case Variable:
    break;
  case Argument:
  case ConstantImport:
    goto switchD_00864eb3_caseD_1;
  case MathConstant:
    pAVar10 = AsmJsMathConst::FromSymbol(sym);
    local_30.which_ = (**(pAVar10->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar10);
    bVar3 = AsmJsType::isDouble(&local_30);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x5c3,"(mathConst->GetType().isDouble())",
                                  "mathConst->GetType().isDouble()");
      if (!bVar3) goto LAB_0086526c;
      *puVar7 = 0;
    }
    RVar6 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
    uVar12 = (ulong)RVar6;
    R1 = AsmJsFunc::GetConstRegister<double>(this->mFunction,*pAVar10->mVal);
    AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Ld_Db,RVar6,R1);
    uVar11 = 2;
    goto LAB_0086521f;
  default:
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Cannot use identifier %s in this context",&name->field_0x22);
    goto LAB_0086525b;
  }
  pAVar9 = AsmJsVar::FromSymbol(sym);
  iVar5 = (*(pAVar9->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(pAVar9);
  if ((char)iVar5 == '\0') {
    if (local_2c[0] != AsmJsModule) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x586,"(source == AsmJsLookupSource::AsmJsModule)",
                                  "source == AsmJsLookupSource::AsmJsModule");
      if (!bVar3) goto LAB_0086526c;
      *puVar7 = 0;
    }
    uVar4 = (**(pAVar9->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol)(pAVar9);
    uVar11 = (ulong)uVar4;
    cVar1 = (pAVar9->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
    if (cVar1 == '\x03') {
      uVar4 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
      RVar6 = AsmJsFunc::GetConstRegister<float>
                        (this->mFunction,(pAVar9->mConstInitialiser).floatVal);
      op = Ld_Flt;
    }
    else {
      if (cVar1 != '\x02') {
        if (cVar1 == '\0') {
          RVar6 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
          uVar12 = (ulong)RVar6;
          AsmJsByteCodeWriter::AsmInt1Const1
                    (&this->mWriter,Ld_IntConst,RVar6,(pAVar9->mConstInitialiser).intVal);
          goto LAB_0086521f;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x595,"(var->GetVarType().isDouble())",
                                    "var->GetVarType().isDouble()");
        if (!bVar3) goto LAB_0086526c;
        *puVar7 = 0;
      }
      uVar4 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
      RVar6 = AsmJsFunc::GetConstRegister<double>
                        (this->mFunction,(pAVar9->mConstInitialiser).doubleVal);
      op = Ld_Db;
    }
    uVar12 = (ulong)uVar4;
    AsmJsByteCodeWriter::AsmReg2(&this->mWriter,op,uVar4,RVar6);
    goto LAB_0086521f;
  }
switchD_00864eb3_caseD_1:
  pAVar8 = AsmJsVarBase::FromSymbol(sym);
  if (local_2c[0] != AsmJsModule) {
    if (local_2c[0] == AsmJsFunction) {
      uVar12 = (ulong)pAVar8->mLocation;
      uVar4 = (**(pAVar8->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar8);
      uVar11 = (ulong)uVar4;
      goto LAB_0086521f;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x5a7,"(source == AsmJsLookupSource::AsmJsModule)",
                                "source == AsmJsLookupSource::AsmJsModule");
    if (!bVar3) goto LAB_0086526c;
    *puVar7 = 0;
  }
  uVar4 = (**(pAVar8->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar8);
  uVar11 = (ulong)uVar4;
  cVar1 = (pAVar8->super_AsmJsSymbol).field_0x14;
  if (cVar1 == '\x03') {
    RVar6 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
    uVar12 = (ulong)RVar6;
    LoadModuleFloat(this,RVar6,pAVar8->mLocation);
  }
  else if (cVar1 == '\x02') {
    RVar6 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
    uVar12 = (ulong)RVar6;
    LoadModuleDouble(this,RVar6,pAVar8->mLocation);
  }
  else if (cVar1 == '\0') {
    RVar6 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
    uVar12 = (ulong)RVar6;
    LoadModuleInt(this,RVar6,pAVar8->mLocation);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x5ba,"((0))","UNREACHED");
    if (!bVar3) {
LAB_0086526c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    uVar12 = 0xffffffffffffffff;
  }
LAB_0086521f:
  return (EmitExpressionInfo)(uVar12 & 0xffffffff | uVar11 << 0x20);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitIdentifier( ParseNode * pnode )
    {
        Assert( ParserWrapper::IsNameDeclaration( pnode ) );
        PropertyName name = pnode->name();
        AsmJsLookupSource::Source source;
        AsmJsSymbol* sym = mCompiler->LookupIdentifier( name, mFunction, &source );
        if( !sym )
        {
            throw AsmJsCompilationException( _u("Undefined identifier %s"), name->Psz() );
        }

        switch( sym->GetSymbolType() )
        {
        case AsmJsSymbol::Variable:
        {
            AsmJsVar * var = AsmJsVar::FromSymbol(sym);
            if (!var->isMutable())
            {
                // currently const is only allowed for variables at module scope
                Assert(source == AsmJsLookupSource::AsmJsModule);

                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    mWriter.AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, emitInfo.location, var->GetIntInitialiser());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, emitInfo.location, mFunction->GetConstRegister<float>(var->GetFloatInitialiser()));
                }
                else
                {
                    Assert(var->GetVarType().isDouble());
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Db, emitInfo.location, mFunction->GetConstRegister<double>(var->GetDoubleInitialiser()));
                }
                return emitInfo;
            }
            // else fall through
        }
        case AsmJsSymbol::Argument:
        case AsmJsSymbol::ConstantImport:
        {
            AsmJsVarBase* var = AsmJsVarBase::FromSymbol(sym);
            if( source == AsmJsLookupSource::AsmJsFunction )
            {
                return EmitExpressionInfo( var->GetLocation(), var->GetType() );
            }
            else
            {
                Assert( source == AsmJsLookupSource::AsmJsModule );
                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    LoadModuleInt(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    LoadModuleFloat(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isDouble())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    LoadModuleDouble(emitInfo.location, var->GetLocation());
                }
                else
                {
                    Assert(UNREACHED);
                }
                return emitInfo;
            }
            break;
        }
        case AsmJsSymbol::MathConstant:
        {
            AsmJsMathConst* mathConst = AsmJsMathConst::FromSymbol(sym);
            Assert(mathConst->GetType().isDouble());
            RegSlot loc = mFunction->AcquireTmpRegister<double>();
            mWriter.AsmReg2( OpCodeAsmJs::Ld_Db, loc, mFunction->GetConstRegister<double>(*mathConst->GetVal()) );
            return EmitExpressionInfo(loc, AsmJsType::Double);
        }

        case AsmJsSymbol::ImportFunction:
        case AsmJsSymbol::FuncPtrTable:
        case AsmJsSymbol::ModuleFunction:
        case AsmJsSymbol::ArrayView:
        case AsmJsSymbol::MathBuiltinFunction:
        default:
            throw AsmJsCompilationException( _u("Cannot use identifier %s in this context"), name->Psz() );
        }
    }